

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::CallContextHooks(ImGuiContext *ctx,ImGuiContextHookType hook_type)

{
  ImGuiContextHook *pIVar1;
  int iVar2;
  ImGuiContext *g;
  long lVar3;
  long lVar4;
  
  iVar2 = (ctx->Hooks).Size;
  if (0 < iVar2) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      pIVar1 = (ctx->Hooks).Data;
      if (*(ImGuiContextHookType *)(pIVar1 + lVar4 + 4) == hook_type) {
        (**(code **)(pIVar1 + lVar4 + 0x10))(ctx,pIVar1 + lVar4);
        iVar2 = (ctx->Hooks).Size;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (lVar3 < iVar2);
  }
  return;
}

Assistant:

void ImGui::CallContextHooks(ImGuiContext* ctx, ImGuiContextHookType hook_type)
{
    ImGuiContext& g = *ctx;
    for (int n = 0; n < g.Hooks.Size; n++)
        if (g.Hooks[n].Type == hook_type)
            g.Hooks[n].Callback(&g, &g.Hooks[n]);
}